

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HierarchicalTaskNetworkComponent.cpp
# Opt level: O1

void __thiscall AI::HierarchicalTaskNetworkComponent::sense(HierarchicalTaskNetworkComponent *this)

{
  Memory *memory;
  pointer pSVar1;
  
  memory = &(this->state).memory;
  pSVar1 = (this->state).memory.sensoryMemory.
           super__Vector_base<AI::Stimulus,_std::allocator<AI::Stimulus>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->state).memory.sensoryMemory.
      super__Vector_base<AI::Stimulus,_std::allocator<AI::Stimulus>_>._M_impl.
      super__Vector_impl_data._M_finish != pSVar1) {
    (this->state).memory.sensoryMemory.
    super__Vector_base<AI::Stimulus,_std::allocator<AI::Stimulus>_>._M_impl.super__Vector_impl_data.
    _M_finish = pSVar1;
  }
  incrementEngramAges(memory);
  pruneOldEngrams(memory);
  senseAuditory(this);
  return;
}

Assistant:

void HierarchicalTaskNetworkComponent::sense()
{
	state.memory.sensoryMemory.clear();

	incrementEngramAges(state.memory);
	pruneOldEngrams(state.memory);

	senseVisual();
	senseAuditory();
}